

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ModelPtr __thiscall libcellml::Parser::ParserImpl::parseModel(ParserImpl *this,string *input)

{
  IssueImpl *this_00;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ModelPtr MVar2;
  IssuePtr issue;
  IssuePtr local_58;
  string local_48;
  
  Logger::LoggerImpl::removeAllIssues((LoggerImpl *)input);
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (in_RDX->_M_string_length == 0) {
    Issue::IssueImpl::create();
    this_00 = (local_58.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              mPimpl;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Model string is empty.","")
    ;
    Issue::IssueImpl::setDescription(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    Issue::IssueImpl::setReferenceRule
              ((local_58.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML);
    Logger::LoggerImpl::addIssue((LoggerImpl *)input,&local_58);
    _Var1._M_pi = extraout_RDX_00;
    if (local_58.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var1._M_pi = extraout_RDX_01;
    }
  }
  else {
    Model::create();
    (this->super_LoggerImpl).mErrors.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48._M_dataplus._M_p;
    (this->super_LoggerImpl).mErrors.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_48._M_string_length;
    loadModel((ParserImpl *)input,(ModelPtr *)this,in_RDX);
    _Var1._M_pi = extraout_RDX;
  }
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Parser::ParserImpl::parseModel(const std::string &input)
{
    removeAllIssues();
    ModelPtr model = nullptr;
    if (input.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Model string is empty.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
        addIssue(issue);
    } else {
        model = Model::create();
        loadModel(model, input);
    }
    return model;
}